

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip_stream.cc
# Opt level: O1

int __thiscall google::protobuf::io::GzipOutputStream::Deflate(GzipOutputStream *this,int flush)

{
  int *piVar1;
  int iVar2;
  LogMessage *other;
  void **ppvVar3;
  LogMessage local_80;
  z_stream *local_48;
  void **local_40;
  LogFinisher local_31;
  
  ppvVar3 = &this->sub_data_;
  piVar1 = &this->sub_data_size_;
  local_48 = &this->zcontext_;
  local_40 = ppvVar3;
  do {
    if ((this->sub_data_ == (void *)0x0) || ((this->zcontext_).avail_out == 0)) {
      iVar2 = (*this->sub_stream_->_vptr_ZeroCopyOutputStream[2])(this->sub_stream_,ppvVar3,piVar1);
      if ((char)iVar2 == '\0') {
        *ppvVar3 = (void *)0x0;
        *piVar1 = 0;
      }
      else {
        if (*piVar1 < 1) {
          internal::LogMessage::LogMessage
                    (&local_80,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/io/gzip_stream.cc"
                     ,0x105);
          other = internal::LogMessage::operator<<
                            (&local_80,"CHECK failed: (sub_data_size_) > (0): ");
          internal::LogFinisher::operator=(&local_31,other);
          internal::LogMessage::~LogMessage(&local_80);
        }
        (this->zcontext_).next_out = (Bytef *)this->sub_data_;
        (this->zcontext_).avail_out = this->sub_data_size_;
        ppvVar3 = local_40;
      }
      if ((char)iVar2 == '\0') {
        return -5;
      }
    }
    iVar2 = deflate(local_48,flush);
    if (iVar2 != 0 || (this->zcontext_).avail_out != 0) {
      if (flush - 3U < 2) {
        (*this->sub_stream_->_vptr_ZeroCopyOutputStream[3])();
        this->sub_data_ = (void *)0x0;
        this->sub_data_size_ = 0;
      }
      return iVar2;
    }
  } while( true );
}

Assistant:

int GzipOutputStream::Deflate(int flush) {
  int error = Z_OK;
  do {
    if ((sub_data_ == NULL) || (zcontext_.avail_out == 0)) {
      bool ok = sub_stream_->Next(&sub_data_, &sub_data_size_);
      if (!ok) {
        sub_data_ = NULL;
        sub_data_size_ = 0;
        return Z_BUF_ERROR;
      }
      GOOGLE_CHECK_GT(sub_data_size_, 0);
      zcontext_.next_out = static_cast<Bytef*>(sub_data_);
      zcontext_.avail_out = sub_data_size_;
    }
    error = deflate(&zcontext_, flush);
  } while (error == Z_OK && zcontext_.avail_out == 0);
  if ((flush == Z_FULL_FLUSH) || (flush == Z_FINISH)) {
    // Notify lower layer of data.
    sub_stream_->BackUp(zcontext_.avail_out);
    // We don't own the buffer anymore.
    sub_data_ = NULL;
    sub_data_size_ = 0;
  }
  return error;
}